

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfBoxAttribute.cpp
# Opt level: O2

void __thiscall
Imf_2_5::TypedAttribute<Imath_2_5::Box<Imath_2_5::Vec2<int>_>_>::writeValueTo
          (TypedAttribute<Imath_2_5::Box<Imath_2_5::Vec2<int>_>_> *this,OStream *os,int version)

{
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(os,(this->_value).min.x);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(os,(this->_value).min.y);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(os,(this->_value).max.x);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(os,(this->_value).max.y);
  return;
}

Assistant:

void
Box2iAttribute::writeValueTo (OPENEXR_IMF_INTERNAL_NAMESPACE::OStream &os, int version) const
{
    Xdr::write <StreamIO> (os, _value.min.x);
    Xdr::write <StreamIO> (os, _value.min.y);
    Xdr::write <StreamIO> (os, _value.max.x);
    Xdr::write <StreamIO> (os, _value.max.y);
}